

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsptree.c
# Opt level: O0

void bsp_get_point(void *handle,int idx,float *point)

{
  int i;
  bsp_tree *tree;
  float *point_local;
  int idx_local;
  void *handle_local;
  
  for (i = 0; i < (int)(uint)*(byte *)((long)handle + 8); i = i + 1) {
    point[i] = *(float *)(*(long *)(*handle + (long)i * 8) + (long)idx * 4);
  }
  return;
}

Assistant:

void
bsp_get_point(
    void * handle,
    int idx,
    float * point )
{
    bsp_tree * tree;
    int i;

    tree = (bsp_tree *) handle;
    assert( tree != NULL && point != NULL );

    assert( idx >= 0 && idx < array_count(tree->pointarrays[0]) );

    for ( i = 0; i < tree->dimensions; i++ )
        point[i] = tree->pointarrays[i][idx];
}